

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KangarooTwelve.c
# Opt level: O3

int KangarooTwelve_Final
              (KangarooTwelve_Instance *ktInstance,uchar *output,uchar *customization,
              size_t customLen)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  byte bVar19;
  byte bVar20;
  uchar delimitedData;
  int iVar21;
  int iVar22;
  long lVar23;
  uint uVar24;
  size_t sVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar35;
  int iVar36;
  undefined1 auVar31 [16];
  int iVar37;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar45 [16];
  uchar encbuf [11];
  uchar intermediate [32];
  uchar local_53 [5];
  undefined1 local_4e;
  undefined1 local_4d;
  undefined1 local_4c;
  uchar local_48 [40];
  
  iVar22 = 1;
  if (ktInstance->phase == ABSORBING) {
    if (customLen == 0) {
      local_53[0] = '\0';
      sVar25 = 1;
    }
    else {
      iVar21 = KangarooTwelve_Update(ktInstance,customization,customLen);
      if (iVar21 != 0) {
        return 1;
      }
      lVar28 = 0;
      sVar25 = customLen;
      bVar19 = 0;
      do {
        bVar20 = bVar19;
        lVar23 = lVar28;
        if (sVar25 < 0x100) break;
        sVar25 = sVar25 >> 8;
        lVar28 = lVar23 + 1;
        bVar19 = bVar20 + 8;
      } while ((uint)lVar23 < 7);
      auVar31._8_4_ = (uint)lVar23;
      auVar31._0_8_ = lVar23;
      auVar31._12_4_ = (int)((ulong)lVar23 >> 0x20);
      auVar31 = auVar31 ^ _DAT_001270e0;
      iVar21 = auVar31._0_4_;
      iVar35 = auVar31._4_4_;
      iVar36 = auVar31._8_4_;
      iVar37 = auVar31._12_4_;
      auVar38._0_4_ = -(uint)(iVar35 == -0x80000000);
      auVar38._4_4_ = -(uint)(iVar35 == -0x80000000);
      auVar38._8_4_ = -(uint)(iVar37 == -0x80000000);
      auVar38._12_4_ = -(uint)(iVar37 == -0x80000000);
      auVar45._4_4_ = -(uint)(iVar21 < -0x80000000);
      auVar45._0_4_ = -(uint)(iVar21 < -0x80000000);
      auVar45._8_4_ = -(uint)(iVar36 < -0x7fffffff);
      auVar45._12_4_ = -(uint)(iVar36 < -0x7fffffff);
      auVar38 = auVar38 & auVar45;
      auVar45 = pshuflw(in_XMM4,auVar38,0xe8);
      auVar39._8_4_ = 0xffffffff;
      auVar39._0_8_ = 0xffffffffffffffff;
      auVar39._12_4_ = 0xffffffff;
      auVar45 = packssdw(auVar45 ^ auVar39,auVar45 ^ auVar39);
      if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_53[0] = (uchar)(customLen >> (bVar20 + 0x40 & 0x3f));
      }
      auVar39 = packssdw(auVar38,auVar38);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar39 = packssdw(auVar39 ^ auVar1,auVar39 ^ auVar1);
      if ((auVar39._0_4_ >> 0x10 & 1) != 0) {
        local_53[1] = (uchar)(customLen >> (bVar20 + 0x38 & 0x3f));
      }
      auVar40._0_4_ = -(uint)(iVar35 == -0x80000000);
      auVar40._4_4_ = -(uint)(iVar35 == -0x80000000);
      auVar40._8_4_ = -(uint)(iVar37 == -0x80000000);
      auVar40._12_4_ = -(uint)(iVar37 == -0x80000000);
      auVar2._4_4_ = -(uint)(iVar21 < -0x7ffffffe);
      auVar2._0_4_ = -(uint)(iVar21 < -0x7ffffffe);
      auVar2._8_4_ = -(uint)(iVar36 < -0x7ffffffd);
      auVar2._12_4_ = -(uint)(iVar36 < -0x7ffffffd);
      auVar40 = auVar40 & auVar2;
      auVar45 = packssdw(auVar45,auVar40);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar45 = packssdw(auVar45 ^ auVar3,auVar45 ^ auVar3);
      if ((auVar45 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        local_53[2] = (uchar)(customLen >> (bVar20 + 0x30 & 0x3f));
      }
      auVar39 = pshufhw(auVar40,auVar40,0x84);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar39 = packssdw(auVar39 ^ auVar4,auVar39 ^ auVar4);
      if ((auVar39 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        local_53[3] = (uchar)(customLen >> (bVar20 + 0x28 & 0x3f));
      }
      auVar41._0_4_ = -(uint)(iVar35 == -0x80000000);
      auVar41._4_4_ = -(uint)(iVar35 == -0x80000000);
      auVar41._8_4_ = -(uint)(iVar37 == -0x80000000);
      auVar41._12_4_ = -(uint)(iVar37 == -0x80000000);
      auVar5._4_4_ = -(uint)(iVar21 < -0x7ffffffc);
      auVar5._0_4_ = -(uint)(iVar21 < -0x7ffffffc);
      auVar5._8_4_ = -(uint)(iVar36 < -0x7ffffffb);
      auVar5._12_4_ = -(uint)(iVar36 < -0x7ffffffb);
      auVar41 = auVar41 & auVar5;
      auVar45 = pshuflw(auVar45,auVar41,0xe8);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      in_XMM4 = packssdw(auVar45 ^ auVar6,auVar45 ^ auVar6);
      if ((in_XMM4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_53[4] = (uchar)(customLen >> (bVar20 + 0x20 & 0x3f));
      }
      auVar45 = packssdw(auVar41,auVar41);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar45 = packssdw(auVar45 ^ auVar7,auVar45 ^ auVar7);
      if ((auVar45 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        local_4e = (undefined1)(customLen >> (bVar20 + 0x18 & 0x3f));
      }
      auVar29._0_4_ = -(uint)(DAT_00127110._4_4_ == iVar35);
      auVar29._4_4_ = -(uint)(DAT_00127110._4_4_ == iVar35);
      auVar29._8_4_ = -(uint)(DAT_00127110._12_4_ == iVar37);
      auVar29._12_4_ = -(uint)(DAT_00127110._12_4_ == iVar37);
      auVar8._4_4_ = -(uint)(iVar21 < (int)DAT_00127110);
      auVar8._0_4_ = -(uint)(iVar21 < (int)DAT_00127110);
      auVar8._8_4_ = -(uint)(iVar36 < DAT_00127110._8_4_);
      auVar8._12_4_ = -(uint)(iVar36 < DAT_00127110._8_4_);
      auVar29 = auVar29 & auVar8;
      auVar45 = packssdw(_DAT_00127110,auVar29);
      auVar32._8_4_ = 0xffffffff;
      auVar32._0_8_ = 0xffffffffffffffff;
      auVar32._12_4_ = 0xffffffff;
      auVar45 = packssdw(auVar45 ^ auVar32,auVar45 ^ auVar32);
      if ((auVar45 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        local_4d = (undefined1)(customLen >> (bVar20 + 0x10 & 0x3f));
      }
      auVar45 = pshufhw(auVar29,auVar29,0x84);
      auVar45 = packssdw(auVar45 ^ auVar32,auVar45 ^ auVar32);
      if ((auVar45 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        local_4c = (undefined1)(customLen >> (bVar20 + 8 & 0x3f));
      }
      sVar25 = lVar23 + 2;
      local_53[lVar23 + 1] = (uchar)(lVar23 + 1);
    }
    iVar21 = KangarooTwelve_Update(ktInstance,local_53,sVar25);
    if (iVar21 == 0) {
      sVar25 = ktInstance->blockNumber;
      if (sVar25 == 0) {
        delimitedData = '\a';
      }
      else {
        if (ktInstance->queueAbsorbedLen != 0) {
          ktInstance->blockNumber = sVar25 + 1;
          iVar22 = KeccakWidth1600_12rounds_SpongeAbsorbLastFewBits(&ktInstance->queueNode,'\v');
          if (iVar22 != 0) {
            return 1;
          }
          iVar22 = KeccakWidth1600_12rounds_SpongeSqueeze(&ktInstance->queueNode,local_48,0x20);
          if (iVar22 != 0) {
            return 1;
          }
          iVar22 = KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode,local_48,0x20);
          if (iVar22 != 0) {
            return 1;
          }
          sVar25 = ktInstance->blockNumber;
        }
        uVar27 = sVar25 - 1;
        ktInstance->blockNumber = uVar27;
        if (uVar27 == 0) {
          lVar28 = 0;
          uVar24 = 1;
        }
        else {
          lVar28 = 0;
          uVar26 = uVar27;
          bVar19 = 0;
          do {
            bVar20 = bVar19;
            lVar23 = lVar28;
            lVar28 = lVar23 + 1;
            uVar24 = (uint)lVar23;
            if (uVar26 < 0x100) break;
            uVar26 = uVar26 >> 8;
            bVar19 = bVar20 + 8;
          } while (uVar24 < 7);
          auVar33._8_4_ = uVar24;
          auVar33._0_8_ = lVar23;
          auVar33._12_4_ = (int)((ulong)lVar23 >> 0x20);
          auVar33 = auVar33 ^ _DAT_001270e0;
          iVar22 = auVar33._0_4_;
          iVar21 = auVar33._4_4_;
          iVar35 = auVar33._8_4_;
          iVar36 = auVar33._12_4_;
          auVar42._0_4_ = -(uint)(iVar21 == -0x80000000);
          auVar42._4_4_ = -(uint)(iVar21 == -0x80000000);
          auVar42._8_4_ = -(uint)(iVar36 == -0x80000000);
          auVar42._12_4_ = -(uint)(iVar36 == -0x80000000);
          auVar9._4_4_ = -(uint)(iVar22 < -0x80000000);
          auVar9._0_4_ = -(uint)(iVar22 < -0x80000000);
          auVar9._8_4_ = -(uint)(iVar35 < -0x7fffffff);
          auVar9._12_4_ = -(uint)(iVar35 < -0x7fffffff);
          auVar42 = auVar42 & auVar9;
          auVar45 = pshuflw(in_XMM4,auVar42,0xe8);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar45 = packssdw(auVar45 ^ auVar10,auVar45 ^ auVar10);
          if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_53[0] = (uchar)(uVar27 >> (bVar20 + 0x40 & 0x3f));
          }
          auVar39 = packssdw(auVar42,auVar42);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar39 = packssdw(auVar39 ^ auVar11,auVar39 ^ auVar11);
          if ((auVar39._0_4_ >> 0x10 & 1) != 0) {
            local_53[1] = (uchar)(uVar27 >> (bVar20 + 0x38 & 0x3f));
          }
          auVar43._0_4_ = -(uint)(iVar21 == -0x80000000);
          auVar43._4_4_ = -(uint)(iVar21 == -0x80000000);
          auVar43._8_4_ = -(uint)(iVar36 == -0x80000000);
          auVar43._12_4_ = -(uint)(iVar36 == -0x80000000);
          auVar12._4_4_ = -(uint)(iVar22 < -0x7ffffffe);
          auVar12._0_4_ = -(uint)(iVar22 < -0x7ffffffe);
          auVar12._8_4_ = -(uint)(iVar35 < -0x7ffffffd);
          auVar12._12_4_ = -(uint)(iVar35 < -0x7ffffffd);
          auVar43 = auVar43 & auVar12;
          auVar45 = packssdw(auVar45,auVar43);
          auVar13._8_4_ = 0xffffffff;
          auVar13._0_8_ = 0xffffffffffffffff;
          auVar13._12_4_ = 0xffffffff;
          auVar45 = packssdw(auVar45 ^ auVar13,auVar45 ^ auVar13);
          if ((auVar45 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_53[2] = (uchar)(uVar27 >> (bVar20 + 0x30 & 0x3f));
          }
          auVar39 = pshufhw(auVar43,auVar43,0x84);
          auVar14._8_4_ = 0xffffffff;
          auVar14._0_8_ = 0xffffffffffffffff;
          auVar14._12_4_ = 0xffffffff;
          auVar39 = packssdw(auVar39 ^ auVar14,auVar39 ^ auVar14);
          if ((auVar39 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_53[3] = (uchar)(uVar27 >> (bVar20 + 0x28 & 0x3f));
          }
          auVar44._0_4_ = -(uint)(iVar21 == -0x80000000);
          auVar44._4_4_ = -(uint)(iVar21 == -0x80000000);
          auVar44._8_4_ = -(uint)(iVar36 == -0x80000000);
          auVar44._12_4_ = -(uint)(iVar36 == -0x80000000);
          auVar15._4_4_ = -(uint)(iVar22 < -0x7ffffffc);
          auVar15._0_4_ = -(uint)(iVar22 < -0x7ffffffc);
          auVar15._8_4_ = -(uint)(iVar35 < -0x7ffffffb);
          auVar15._12_4_ = -(uint)(iVar35 < -0x7ffffffb);
          auVar44 = auVar44 & auVar15;
          auVar45 = pshuflw(auVar45,auVar44,0xe8);
          auVar16._8_4_ = 0xffffffff;
          auVar16._0_8_ = 0xffffffffffffffff;
          auVar16._12_4_ = 0xffffffff;
          auVar45 = packssdw(auVar45 ^ auVar16,auVar45 ^ auVar16);
          if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_53[4] = (uchar)(uVar27 >> (bVar20 + 0x20 & 0x3f));
          }
          auVar45 = packssdw(auVar44,auVar44);
          auVar17._8_4_ = 0xffffffff;
          auVar17._0_8_ = 0xffffffffffffffff;
          auVar17._12_4_ = 0xffffffff;
          auVar45 = packssdw(auVar45 ^ auVar17,auVar45 ^ auVar17);
          if ((auVar45 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            local_4e = (undefined1)(uVar27 >> (bVar20 + 0x18 & 0x3f));
          }
          auVar30._0_4_ = -(uint)(DAT_00127110._4_4_ == iVar21);
          auVar30._4_4_ = -(uint)(DAT_00127110._4_4_ == iVar21);
          auVar30._8_4_ = -(uint)(DAT_00127110._12_4_ == iVar36);
          auVar30._12_4_ = -(uint)(DAT_00127110._12_4_ == iVar36);
          auVar18._4_4_ = -(uint)(iVar22 < (int)DAT_00127110);
          auVar18._0_4_ = -(uint)(iVar22 < (int)DAT_00127110);
          auVar18._8_4_ = -(uint)(iVar35 < DAT_00127110._8_4_);
          auVar18._12_4_ = -(uint)(iVar35 < DAT_00127110._8_4_);
          auVar30 = auVar30 & auVar18;
          auVar45 = packssdw(_DAT_00127110,auVar30);
          auVar34._8_4_ = 0xffffffff;
          auVar34._0_8_ = 0xffffffffffffffff;
          auVar34._12_4_ = 0xffffffff;
          auVar45 = packssdw(auVar45 ^ auVar34,auVar45 ^ auVar34);
          if ((auVar45 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_4d = (undefined1)(uVar27 >> (bVar20 + 0x10 & 0x3f));
          }
          uVar24 = uVar24 + 2;
          auVar45 = pshufhw(auVar30,auVar30,0x84);
          auVar45 = packssdw(auVar45 ^ auVar34,auVar45 ^ auVar34);
          if ((auVar45 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_4c = (undefined1)(uVar27 >> (bVar20 + 8 & 0x3f));
          }
        }
        local_53[lVar28] = (uchar)lVar28;
        local_53[uVar24] = 0xff;
        local_53[uVar24 + 1] = 0xff;
        iVar22 = KeccakWidth1600_12rounds_SpongeAbsorb
                           (&ktInstance->finalNode,local_53,(ulong)(uVar24 + 2));
        if (iVar22 != 0) {
          return 1;
        }
        delimitedData = '\x06';
      }
      iVar21 = KeccakWidth1600_12rounds_SpongeAbsorbLastFewBits
                         (&ktInstance->finalNode,delimitedData);
      iVar22 = 1;
      if (iVar21 == 0) {
        if (ktInstance->fixedOutputLength == 0) {
          ktInstance->phase = SQUEEZING;
          iVar22 = 0;
        }
        else {
          ktInstance->phase = FINAL;
          iVar22 = KeccakWidth1600_12rounds_SpongeSqueeze
                             (&ktInstance->finalNode,output,ktInstance->fixedOutputLength);
        }
      }
    }
  }
  return iVar22;
}

Assistant:

int KangarooTwelve_Final(KangarooTwelve_Instance *ktInstance, unsigned char * output, const unsigned char * customization, size_t customLen)
{
    unsigned char encbuf[sizeof(size_t)+1+2];
    unsigned char padding;

    if (ktInstance->phase != ABSORBING)
        return 1;

    /* Absorb customization | right_encode(customLen) */
    if ((customLen != 0) && (KangarooTwelve_Update(ktInstance, customization, customLen) != 0))
        return 1;
    if (KangarooTwelve_Update(ktInstance, encbuf, right_encode(encbuf, customLen)) != 0)
        return 1;

    if ( ktInstance->blockNumber == 0 ) {
        /* Non complete first block in final node, pad it */
        padding = 0x07; /*  '11': message hop, final node */
    }
    else {
        unsigned int n;

        if ( ktInstance->queueAbsorbedLen != 0 ) {
            /* There is data in the queue node */
            unsigned char intermediate[capacityInBytes];
            ++ktInstance->blockNumber;
            if (KeccakWidth1600_12rounds_SpongeAbsorbLastFewBits(&ktInstance->queueNode, suffixLeaf) != 0)
                return 1;
            if (KeccakWidth1600_12rounds_SpongeSqueeze(&ktInstance->queueNode, intermediate, capacityInBytes) != 0)
                return 1;
            if (KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode, intermediate, capacityInBytes) != 0)
                return 1;
        }
        --ktInstance->blockNumber; /* Absorb right_encode(number of Chaining Values) || 0xFF || 0xFF */
        n = right_encode(encbuf, ktInstance->blockNumber);
        encbuf[n++] = 0xFF;
        encbuf[n++] = 0xFF;
        if (KeccakWidth1600_12rounds_SpongeAbsorb(&ktInstance->finalNode, encbuf, n) != 0)
            return 1;
        padding = 0x06; /* '01': chaining hop, final node */
    }
    if (KeccakWidth1600_12rounds_SpongeAbsorbLastFewBits(&ktInstance->finalNode, padding) != 0)
        return 1;
    if ( ktInstance->fixedOutputLength != 0 ) {
        ktInstance->phase = FINAL;
        return KeccakWidth1600_12rounds_SpongeSqueeze(&ktInstance->finalNode, output, ktInstance->fixedOutputLength);
    }
    ktInstance->phase = SQUEEZING;
    return 0;
}